

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcheckmesh.cpp
# Opt level: O3

int __thiscall TPZCheckMesh::CheckConnectSeqNumberConsistency(TPZCheckMesh *this)

{
  long lVar1;
  TPZConnect *pTVar2;
  ostream *poVar3;
  ulong uVar4;
  int64_t ic;
  byte bVar5;
  long lVar6;
  long lVar7;
  
  lVar1 = (this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>.fNElements;
  if (0 < lVar1) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      pTVar2 = TPZChunkVector<TPZConnect,_10>::operator[]
                         (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,lVar7);
      uVar4 = 0;
      if (pTVar2->fNElConnected != 0) {
        uVar4 = (ulong)(pTVar2->field_2).fCompose.fIsCondensed ^ 1;
      }
      if (pTVar2->fDependList != (TPZDepend *)0x0) {
        uVar4 = 0;
      }
      lVar6 = lVar6 + uVar4;
      lVar7 = lVar7 + 1;
    } while (lVar1 != lVar7);
    if (lVar6 != 0 && 0 < lVar1) {
      bVar5 = 0;
      lVar7 = 0;
      do {
        pTVar2 = TPZChunkVector<TPZConnect,_10>::operator[]
                           (&(this->fMesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,lVar7);
        if ((((pTVar2->fDependList != (TPZDepend *)0x0) || (pTVar2->fNElConnected == 0)) ||
            ((pTVar2->field_2).fCompose.fIsCondensed == true)) &&
           (pTVar2->fSequenceNumber != -1 && pTVar2->fSequenceNumber < lVar6)) {
          poVar3 = this->fOut;
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Connect index ",0xe);
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3," has inconsistent sequence number ",0x22);
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," nindependent connects ",0x17);
          poVar3 = std::ostream::_M_insert<long>((long)poVar3);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
          std::ostream::put((char)poVar3);
          std::ostream::flush();
          bVar5 = 1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar1 != lVar7);
      return (uint)bVar5;
    }
  }
  return 0;
}

Assistant:

int TPZCheckMesh::CheckConnectSeqNumberConsistency()
{
    bool wrong = false;
    int64_t numindepconnect = 0;
    int64_t nconnect = fMesh->NConnects();
    for (int64_t ic=0; ic<nconnect; ic++) {
        TPZConnect &c = fMesh->ConnectVec()[ic];
        if (!c.HasDependency() && c.NElConnected() && !c.IsCondensed()) {
            numindepconnect++;
        }
    }
    if (numindepconnect == 0) {
        return 0;
    }
    for (int64_t ic=0; ic<nconnect; ic++) {
        TPZConnect &c = fMesh->ConnectVec()[ic];
        if (c.HasDependency() || !c.NElConnected() || c.IsCondensed()) {
            int64_t seqnum = c.SequenceNumber();
            if (seqnum < numindepconnect && seqnum != -1) { // @omar need more information about this case seqnum != -1
                *fOut << "Connect index " << ic << " has inconsistent sequence number " << seqnum << " nindependent connects " << numindepconnect << std::endl;
                wrong = true;
            }
        }
    }
    if (wrong == false) {
        return 0;
    }
    else
    {
        return 1;
    }
}